

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Status SVar5;
  string *psVar6;
  ostream *poVar7;
  char *pcVar8;
  size_t sVar9;
  FILE *__stream;
  pointer pbVar10;
  uint uVar11;
  ulong uVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string modulesPath;
  string destPath;
  string resultFile;
  string inFile;
  string cwd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string outFile;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1140;
  string local_1120;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_1100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f8;
  undefined1 local_10d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10b0;
  cmExternalMakefileProjectGeneratorFactory *local_10a8 [2];
  string local_1098;
  undefined1 local_1078 [32];
  string local_1058;
  undefined1 local_1038 [32];
  int local_1018;
  
  local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
  local_10f8._M_string_length = 0;
  local_10f8.field_2._M_local_buf[0] = '\0';
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  local_1120._M_dataplus._M_p = (pointer)&local_1120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1120,local_10b8,(undefined1 *)((long)local_10b0 + (long)local_10b8));
  std::__cxx11::string::append((char *)&local_1120);
  cmsys::SystemTools::RemoveADirectory(&local_1120);
  SVar5 = cmsys::SystemTools::MakeDirectory(&local_1120,(mode_t *)0x0);
  if (SVar5.Kind_ == Success) {
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    bVar2 = true;
    if (0x20 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10)) {
      uVar12 = 1;
      bVar2 = true;
      do {
        uVar11 = (uint)uVar12;
        local_1038._8_8_ = pbVar10[uVar12]._M_dataplus._M_p;
        local_1038._0_8_ = pbVar10[uVar12]._M_string_length;
        __str._M_str = "-G";
        __str._M_len = 2;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_1038,0,2,__str)
        ;
        psVar6 = pbVar10 + uVar12;
        if (iVar3 == 0) {
          std::__cxx11::string::substr((ulong)local_1038,(ulong)psVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038._8_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            uVar11 = uVar11 + 1;
            if ((ulong)uVar11 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)local_1038);
              goto LAB_002279f6;
            }
            local_1140._M_dataplus._M_p = (pointer)&local_1140.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1140,"No generator specified for -G","");
            cmSystemTools::Error(&local_1140);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1140._M_dataplus._M_p != &local_1140.field_2) {
              operator_delete(local_1140._M_dataplus._M_p,
                              local_1140.field_2._M_allocated_capacity + 1);
            }
            PrintGeneratorList(this);
            bVar1 = false;
          }
          else {
LAB_002279f6:
            CreateGlobalGenerator
                      ((cmake *)local_10d8,(string *)this,
                       SUB81((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1038,0));
            if ((char *)local_10d8._0_8_ == (char *)0x0) {
              std::operator+(&local_1140,"Could not create named generator ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1038);
              cmSystemTools::Error(&local_1140);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1140._M_dataplus._M_p != &local_1140.field_2) {
                operator_delete(local_1140._M_dataplus._M_p,
                                local_1140.field_2._M_allocated_capacity + 1);
              }
              PrintGeneratorList(this);
            }
            else {
              local_1100._M_head_impl = (cmGlobalGenerator *)local_10d8._0_8_;
              SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                       *)&local_1100);
              if (local_1100._M_head_impl != (cmGlobalGenerator *)0x0) {
                (*(local_1100._M_head_impl)->_vptr_cmGlobalGenerator[1])();
              }
              local_1100._M_head_impl = (cmGlobalGenerator *)0x0;
            }
            bVar1 = true;
          }
          if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
            operator_delete((void *)local_1038._0_8_,local_1038._16_8_ + 1);
          }
          if (!bVar1) {
            iVar3 = -1;
            goto LAB_00227ff0;
          }
        }
        else {
          bVar2 = cmsys::SystemTools::FileIsFullPath(psVar6);
          if (!bVar2) {
            local_1038._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            local_1140.field_2._8_8_ = local_1038 + 0x10;
            local_1038[0x10] = 0x2f;
            local_1140._M_dataplus._M_p = (pointer)local_10b0;
            local_1140._M_string_length = (size_type)local_10b8;
            local_1140.field_2._M_allocated_capacity = 1;
            views._M_len = 2;
            views._M_array = (iterator)&local_1140;
            local_1038._8_8_ = local_1140.field_2._8_8_;
            cmCatViews_abi_cxx11_((string *)local_10d8,views);
            std::__cxx11::string::operator=((string *)&local_10f8,(string *)local_10d8);
            if ((undefined1 *)local_10d8._0_8_ != local_10d8 + 0x10) {
              operator_delete((void *)local_10d8._0_8_,local_10d8._16_8_ + 1);
            }
          }
          std::__cxx11::string::_M_append((char *)&local_10f8,(ulong)(psVar6->_M_dataplus)._M_p);
          bVar2 = false;
        }
        uVar12 = (ulong)(uVar11 + 1);
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >>
                               5));
    }
    AddCMakePaths(this);
    psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    local_1038._8_8_ = (psVar6->_M_dataplus)._M_p;
    local_1038._0_8_ = psVar6->_M_string_length;
    local_1038._16_8_ = 8;
    local_1038._24_8_ = "/Modules";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_1038;
    cmCatViews_abi_cxx11_(&local_1140,views_00);
    local_1038._0_8_ = local_1140._M_string_length;
    local_1038._8_8_ = local_1140._M_dataplus._M_p;
    local_1038._16_8_ = 0x18;
    local_1038._24_8_ = "/SystemInformation.cmake";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_1038;
    cmCatViews_abi_cxx11_((string *)local_10d8,views_01);
    local_1038._0_8_ = local_1120._M_string_length;
    local_1038._8_8_ = local_1120._M_dataplus._M_p;
    local_1038._16_8_ = 0xf;
    local_1038._24_8_ = "/CMakeLists.txt";
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_1038;
    cmCatViews_abi_cxx11_(&local_1058,views_02);
    SVar5 = cmsys::SystemTools::CopyFileAlways((string *)local_10d8,&local_1058);
    if (SVar5.Kind_ == Success) {
      if (local_10f8._M_string_length == 0) {
        local_1038._0_8_ = local_10b0;
        local_1038._8_8_ = local_10b8;
        local_1038._16_8_ = 0x26;
        local_1038._24_8_ = "/__cmake_systeminformation/results.txt";
        views_03._M_len = 2;
        views_03._M_array = (iterator)local_1038;
        cmCatViews_abi_cxx11_(&local_1098,views_03);
        std::__cxx11::string::operator=((string *)&local_10f8,(string *)&local_1098);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
          operator_delete(local_1098._M_dataplus._M_p,
                          (ulong)(local_1098.field_2._M_allocated_capacity + 1));
        }
      }
      cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_1038,&local_1120);
      if (local_1018 == 0) {
        local_1078._0_8_ = (pointer)0x0;
        local_1078._8_8_ = (pointer)0x0;
        local_1078._16_8_ = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1078,
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1078,&local_1120);
        std::operator+(&local_1098,"-DRESULT_FILE=",&local_10f8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1078,
                   &local_1098);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
          operator_delete(local_1098._M_dataplus._M_p,
                          (ulong)(local_1098.field_2._M_allocated_capacity + 1));
        }
        iVar4 = Run(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1078,false);
        if (iVar4 == 0) {
          iVar3 = -1;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: --system-information failed on internal CMake!\n"
                     ,0x36);
          iVar3 = iVar4;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1078);
        cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_1038);
        if (iVar4 == 0) {
          if ((bVar2) &&
             (__stream = (FILE *)cmsys::SystemTools::Fopen(&local_10f8,"r"), __stream != (FILE *)0x0
             )) {
            sVar9 = fread(local_1038,1,0x1000,__stream);
            while (sVar9 != 0) {
              if (0 < (long)sVar9) {
                pcVar8 = local_1038;
                do {
                  putc((int)*pcVar8,_stdout);
                  pcVar8 = pcVar8 + 1;
                } while (pcVar8 < local_1038 + sVar9);
              }
              fflush(_stdout);
              sVar9 = fread(local_1038,1,0x1000,__stream);
            }
            fclose(__stream);
          }
          iVar3 = 0;
          cmsys::SystemTools::RemoveADirectory(&local_1120);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to change to directory ",0x1e);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1120._M_dataplus._M_p,
                            local_1120._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," : ",3);
        pcVar8 = strerror(local_1018);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
        }
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_1038);
        iVar3 = 1;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error copying file \"",0x14);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_10d8._0_8_,local_10d8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" to \"",6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1058._M_dataplus._M_p,local_1058._M_string_length);
      iVar3 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
      operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_10d8._0_8_ != local_10d8 + 0x10) {
      operator_delete((void *)local_10d8._0_8_,local_10d8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1140._M_dataplus._M_p != &local_1140.field_2) {
      operator_delete(local_1140._M_dataplus._M_p,local_1140.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar3 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Error: --system-information must be run from a writable directory!\n",0x43);
  }
LAB_00227ff0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1120._M_dataplus._M_p != &local_1120.field_2) {
    operator_delete(local_1120._M_dataplus._M_p,local_1120.field_2._M_allocated_capacity + 1);
  }
  if (local_10b8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10a8) {
    operator_delete(local_10b8,
                    (ulong)((long)&local_10a8[0]->_vptr_cmExternalMakefileProjectGeneratorFactory +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
    operator_delete(local_10f8._M_dataplus._M_p,
                    CONCAT71(local_10f8.field_2._M_allocated_capacity._1_7_,
                             local_10f8.field_2._M_local_buf[0]) + 1);
  }
  return iVar3;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath)) {
    std::cerr << "Error: --system-information must be run from a "
                 "writable directory!\n";
    return 1;
  }

  // process the arguments
  bool writeToStdout = true;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (cmHasLiteralPrefix(arg, "-G")) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
        }
        value = args[i];
      }
      auto gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator " + value);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(std::move(gen));
      }
    }
    // no option assume it is the output file
    else {
      if (!cmSystemTools::FileIsFullPath(arg)) {
        resultFile = cmStrCat(cwd, '/');
      }
      resultFile += arg;
      writeToStdout = false;
    }
  }

  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules");
  std::string inFile = cmStrCat(modulesPath, "/SystemInformation.cmake");
  std::string outFile = cmStrCat(destPath, "/CMakeLists.txt");

  // Copy file
  if (!cmsys::SystemTools::CopyFileAlways(inFile, outFile)) {
    std::cerr << "Error copying file \"" << inFile << "\" to \"" << outFile
              << "\".\n";
    return 1;
  }

  // do we write to a file or to stdout?
  if (resultFile.empty()) {
    resultFile = cmStrCat(cwd, "/__cmake_systeminformation/results.txt");
  }

  {
    // now run cmake on the CMakeLists file
    cmWorkingDirectory workdir(destPath);
    if (workdir.Failed()) {
      // We created the directory and we were able to copy the CMakeLists.txt
      // file to it, so we wouldn't expect to get here unless the default
      // permissions are questionable or some other process has deleted the
      // directory
      std::cerr << "Failed to change to directory " << destPath << " : "
                << std::strerror(workdir.GetLastResult()) << std::endl;
      return 1;
    }
    std::vector<std::string> args2;
    args2.push_back(args[0]);
    args2.push_back(destPath);
    args2.push_back("-DRESULT_FILE=" + resultFile);
    int res = this->Run(args2, false);

    if (res != 0) {
      std::cerr << "Error: --system-information failed on internal CMake!\n";
      return res;
    }
  }

  // echo results to stdout if needed
  if (writeToStdout) {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if (fin) {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while ((n = fread(buffer, 1, bufferSize, fin)) > 0) {
        for (char* c = buffer; c < buffer + n; ++c) {
          putc(*c, stdout);
        }
        fflush(stdout);
      }
      fclose(fin);
    }
  }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}